

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySet::AddModule
          (cmInstallRuntimeDependencySet *this,cmInstallImportedRuntimeArtifactsGenerator *module)

{
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,_std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>_>
  local_28;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_20;
  cmInstallImportedRuntimeArtifactsGenerator *local_18;
  cmInstallImportedRuntimeArtifactsGenerator *module_local;
  cmInstallRuntimeDependencySet *this_local;
  
  local_18 = module;
  module_local = (cmInstallImportedRuntimeArtifactsGenerator *)this;
  std::
  make_unique<cmInstallRuntimeDependencySet::ImportedTargetItem,cmInstallImportedRuntimeArtifactsGenerator*&>
            ((cmInstallImportedRuntimeArtifactsGenerator **)&local_28);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
  ::
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>,void>
            ((unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
              *)&local_20,&local_28);
  AddModule(this,&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,_std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void AddModule(cmInstallImportedRuntimeArtifactsGenerator* module)
  {
    this->AddModule(cm::make_unique<ImportedTargetItem>(module));
  }